

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

QString * preprocessMetadata(QString *__return_storage_ptr__,QString *in)

{
  Data *pDVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  QString *extraout_RDX;
  QString *extraout_RDX_00;
  QString *extraout_RDX_01;
  QString *extraout_RDX_02;
  QString *extraout_RDX_03;
  QString *extraout_RDX_04;
  QString *extraout_RDX_05;
  QString *extraout_RDX_06;
  QString *pQVar6;
  QString *extraout_RDX_07;
  undefined1 *puVar7;
  long lVar8;
  long in_FS_OFFSET;
  QString local_98;
  QString local_78;
  QArrayDataPointer<QString> local_58;
  QString *local_38;
  
  local_38 = *(QString **)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QString::split((QStringList *)&local_58,in,(QChar)0x5c,(SplitBehavior)0x0,CaseSensitive);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
    lVar8 = 0;
    puVar7 = (undefined1 *)0x0;
    pQVar6 = extraout_RDX;
    do {
      local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QString::simplified_helper(&local_78,(QString *)((long)&((local_58.ptr)->d).d + lVar8),pQVar6)
      ;
      pQVar6 = extraout_RDX_00;
      if ((undefined1 *)0x1 < (ulong)local_78.d.size) {
        local_98.d.d = (Data *)0x0;
        local_98.d.ptr = L"\"";
        local_98.d.size = 1;
        bVar5 = QString::startsWith(&local_78,&local_98,CaseSensitive);
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (bVar5) {
          if ((undefined1 *)local_78.d.size == (undefined1 *)0x0) {
            local_98.d.d = local_78.d.d;
            local_98.d.ptr = local_78.d.ptr;
            local_98.d.size = 0;
            if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   1;
              UNLOCK();
            }
          }
          else {
            QString::QString(&local_98,(QChar *)((long)&((DataPointer *)local_78.d.ptr)->d + 2),
                             (qsizetype)(local_78.d.size + -1));
          }
          pcVar4 = local_78.d.ptr;
          pDVar3 = local_78.d.d;
          qVar2 = local_98.d.size;
          pDVar1 = local_98.d.d;
          local_98.d.d = local_78.d.d;
          local_78.d.d = pDVar1;
          local_78.d.ptr = local_98.d.ptr;
          local_98.d.ptr = pcVar4;
          local_98.d.size = local_78.d.size;
          local_78.d.size = qVar2;
          if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
            }
          }
        }
        local_98.d.d = (Data *)0x0;
        local_98.d.ptr = L"\"";
        local_98.d.size = 1;
        bVar5 = QString::endsWith(&local_78,&local_98,CaseSensitive);
        pQVar6 = extraout_RDX_01;
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
            pQVar6 = extraout_RDX_02;
          }
        }
        if (bVar5) {
          if ((undefined1 *)local_78.d.size == (undefined1 *)0x0) {
            local_98.d.d = local_78.d.d;
            local_98.d.ptr = local_78.d.ptr;
            local_98.d.size = 0;
            if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   1;
              UNLOCK();
            }
          }
          else {
            QString::QString(&local_98,(QChar *)local_78.d.ptr,(qsizetype)(local_78.d.size + -1));
          }
          pcVar4 = local_78.d.ptr;
          pDVar3 = local_78.d.d;
          qVar2 = local_98.d.size;
          pQVar6 = (QString *)local_98.d.ptr;
          pDVar1 = local_98.d.d;
          local_98.d.d = local_78.d.d;
          local_78.d.d = pDVar1;
          local_78.d.ptr = local_98.d.ptr;
          local_98.d.ptr = pcVar4;
          local_98.d.size = local_78.d.size;
          local_78.d.size = qVar2;
          if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
              pQVar6 = extraout_RDX_03;
            }
          }
        }
        QString::simplified_helper(&local_98,&local_78,pQVar6);
        pcVar4 = local_78.d.ptr;
        pDVar3 = local_78.d.d;
        qVar2 = local_98.d.size;
        pDVar1 = local_98.d.d;
        local_98.d.d = local_78.d.d;
        local_78.d.d = pDVar1;
        local_78.d.ptr = local_98.d.ptr;
        local_98.d.ptr = pcVar4;
        local_98.d.size = local_78.d.size;
        local_78.d.size = qVar2;
        pQVar6 = extraout_RDX_04;
        if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
            pQVar6 = extraout_RDX_05;
          }
        }
        if ((undefined1 *)0x1 < (ulong)local_78.d.size) {
          if ((__return_storage_ptr__->d).size != 0) {
            QString::append(__return_storage_ptr__,(QChar)0xa);
          }
          QString::append(__return_storage_ptr__,&local_78);
          pQVar6 = extraout_RDX_06;
        }
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          pQVar6 = extraout_RDX_07;
        }
      }
      puVar7 = puVar7 + 1;
      lVar8 = lVar8 + 0x18;
    } while (puVar7 < (ulong)local_58.size);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(QString **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(QString **)(in_FS_OFFSET + 0x28);
}

Assistant:

static QString preprocessMetadata(const QString &in)
{
    DEBUGPRINTF(printf("in: %s\n", qPrintable(in)));
    QList<QString> lines = in.split(QLatin1Char('\\'));
    QString out;
    for (int i = 0; i < lines.size(); i++) {
        QString l = lines.at(i).simplified();
        DEBUGPRINTF(printf("line: %s\n", qPrintable(l)));
        if (l.length() < 2)
            continue;
        if (l.startsWith(QStringLiteral("\"")))
            l = l.right(l.length() - 1);
        if (l.endsWith(QStringLiteral("\"")))
            l = l.left(l.length() - 1);
        l = l.simplified();

        if (l.length() > 1) {
            if (out.size() > 0)
                out.append(QLatin1Char('\n'));
            out.append(l);
        }
    }
    DEBUGPRINTF(printf("out: %s\n", qPrintable(out)));
    return out;
}